

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
          (optional<tinyusdz::APISchemas> *this,optional<tinyusdz::APISchemas> *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      std::
      vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&this->contained + 8));
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      initialize<tinyusdz::APISchemas>(this,(APISchemas *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
    std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_move_assign((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&this->contained + 8),(undefined1 *)((long)&other->contained + 8));
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }